

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegExpConstructor.cpp
# Opt level: O1

BOOL __thiscall
Js::JavascriptRegExpConstructor::DeleteProperty
          (JavascriptRegExpConstructor *this,PropertyId propertyId,PropertyOperationFlags flags)

{
  ScriptContext *this_00;
  BOOL BVar1;
  PropertyRecord *pPVar2;
  
  if ((0xf < propertyId - 0x1d0U) && (3 < propertyId - 0x1e3U)) {
    BVar1 = JavascriptFunction::DeleteProperty((JavascriptFunction *)this,propertyId,flags);
    return BVar1;
  }
  this_00 = (((((this->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.
                super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
            super_JavascriptLibraryBase).scriptContext.ptr;
  pPVar2 = ScriptContext::GetPropertyName(this_00,propertyId);
  JavascriptError::ThrowCantDeleteIfStrictMode(flags,this_00,(PCWSTR)(pPVar2 + 1));
  return 0;
}

Assistant:

BOOL JavascriptRegExpConstructor::DeleteProperty(PropertyId propertyId, PropertyOperationFlags flags)
    {
        switch (propertyId)
        {
            // all globals are 'fNoDelete' in V5.8
        case PropertyIds::input:
        case PropertyIds::$_:
        case PropertyIds::lastMatch:
        case PropertyIds::$Ampersand:
        case PropertyIds::lastParen:
        case PropertyIds::$Plus:
        case PropertyIds::leftContext:
        case PropertyIds::$BackTick:
        case PropertyIds::rightContext:
        case PropertyIds::$Tick:
        case PropertyIds::$1:
        case PropertyIds::$2:
        case PropertyIds::$3:
        case PropertyIds::$4:
        case PropertyIds::$5:
        case PropertyIds::$6:
        case PropertyIds::$7:
        case PropertyIds::$8:
        case PropertyIds::$9:
        case PropertyIds::index:
            JavascriptError::ThrowCantDeleteIfStrictMode(flags, GetScriptContext(), GetScriptContext()->GetPropertyName(propertyId)->GetBuffer());
            return false;

        default:
            return JavascriptFunction::DeleteProperty(propertyId, flags);
        }
    }